

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_wstring_append_from_mbs(archive_wstring *dest,char *p,size_t len)

{
  archive_wstring *paVar1;
  char *pcVar2;
  int *piVar3;
  mbstate_t local_60;
  mbstate_t_conflict shift_state;
  wchar_t *wcs;
  char *mbs;
  size_t mbs_length;
  size_t wcs_length;
  wchar_t ret_val;
  size_t r;
  size_t len_local;
  char *p_local;
  archive_wstring *dest_local;
  
  wcs_length._4_4_ = L'\0';
  memset(&local_60,0,8);
  paVar1 = archive_wstring_ensure(dest,dest->length + len + 1);
  if (paVar1 == (archive_wstring *)0x0) {
    dest_local._4_4_ = L'\xffffffff';
  }
  else {
    shift_state = (mbstate_t_conflict)(dest->s + dest->length);
    wcs = (wchar_t *)p;
    mbs = (char *)len;
    mbs_length = len;
    while ((char)*wcs != '\0' && mbs != (char *)0x0) {
      if (mbs_length == 0) {
        dest->length = (long)shift_state - (long)dest->s >> 2;
        dest->s[dest->length] = L'\0';
        mbs_length = (size_t)mbs;
        paVar1 = archive_wstring_ensure(dest,(size_t)(mbs + dest->length + 1));
        if (paVar1 == (archive_wstring *)0x0) {
          return L'\xffffffff';
        }
        shift_state = (mbstate_t_conflict)(dest->s + dest->length);
      }
      pcVar2 = (char *)mbrtowc((wchar_t *)shift_state,(char *)wcs,mbs_length,&local_60);
      if ((pcVar2 == (char *)0xffffffffffffffff) || (pcVar2 == (char *)0xfffffffffffffffe)) {
        wcs_length._4_4_ = L'\xffffffff';
        piVar3 = __errno_location();
        if (*piVar3 != 0x54) break;
        wcs = (wchar_t *)((long)wcs + 1);
        mbs = mbs + -1;
      }
      else {
        if ((pcVar2 == (char *)0x0) || (mbs < pcVar2)) break;
        shift_state = (mbstate_t_conflict)((long)shift_state + 4);
        mbs_length = mbs_length - 1;
        wcs = (wchar_t *)(pcVar2 + (long)wcs);
        mbs = mbs + -(long)pcVar2;
      }
    }
    dest->length = (long)shift_state - (long)dest->s >> 2;
    dest->s[dest->length] = L'\0';
    dest_local._4_4_ = wcs_length._4_4_;
  }
  return dest_local._4_4_;
}

Assistant:

int
archive_wstring_append_from_mbs(struct archive_wstring *dest,
    const char *p, size_t len)
{
	size_t r;
	int ret_val = 0;
	/*
	 * No single byte will be more than one wide character,
	 * so this length estimate will always be big enough.
	 */
	size_t wcs_length = len;
	size_t mbs_length = len;
	const char *mbs = p;
	wchar_t *wcs;
#if HAVE_MBRTOWC
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#endif
	if (NULL == archive_wstring_ensure(dest, dest->length + wcs_length + 1))
		return (-1);
	wcs = dest->s + dest->length;
	/*
	 * We cannot use mbsrtowcs/mbstowcs here because those may convert
	 * extra MBS when strlen(p) > len and one wide character consists of
	 * multi bytes.
	 */
	while (*mbs && mbs_length > 0) {
		if (wcs_length == 0) {
			dest->length = wcs - dest->s;
			dest->s[dest->length] = L'\0';
			wcs_length = mbs_length;
			if (NULL == archive_wstring_ensure(dest,
			    dest->length + wcs_length + 1))
				return (-1);
			wcs = dest->s + dest->length;
		}
#if HAVE_MBRTOWC
		r = mbrtowc(wcs, mbs, wcs_length, &shift_state);
#else
		r = mbtowc(wcs, mbs, wcs_length);
#endif
		if (r == (size_t)-1 || r == (size_t)-2) {
			ret_val = -1;
			if (errno == EILSEQ) {
				++mbs;
				--mbs_length;
				continue;
			} else
				break;
		}
		if (r == 0 || r > mbs_length)
			break;
		wcs++;
		wcs_length--;
		mbs += r;
		mbs_length -= r;
	}
	dest->length = wcs - dest->s;
	dest->s[dest->length] = L'\0';
	return (ret_val);
}